

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O2

pboolean p_socket_address_is_loopback(PSocketAddress *addr)

{
  bool bVar1;
  
  if (addr != (PSocketAddress *)0x0) {
    if (addr->family == P_SOCKET_FAMILY_INET) {
      bVar1 = *(char *)&addr->addr == '\x7f';
      goto LAB_001135e4;
    }
    if ((((addr->family != P_SOCKET_FAMILY_UNKNOWN) && ((addr->addr).sin_addr.s_addr == 0)) &&
        (*(int *)((long)&addr->addr + 4) == 0)) && (*(int *)((long)&addr->addr + 8) == 0)) {
      bVar1 = *(int *)((long)&addr->addr + 0xc) == 0x1000000;
      goto LAB_001135e4;
    }
  }
  bVar1 = false;
LAB_001135e4:
  return (pboolean)bVar1;
}

Assistant:

P_LIB_API pboolean
p_socket_address_is_loopback (const PSocketAddress *addr)
{
	puint32 addr4;

	if (P_UNLIKELY (addr == NULL || addr->family == P_SOCKET_FAMILY_UNKNOWN))
		return FALSE;

	if (addr->family == P_SOCKET_FAMILY_INET) {
		addr4 = p_ntohl (* ((puint32 *) &addr->addr.sin_addr));

		/* 127.0.0.0/8 */
		return ((addr4 & 0xff000000) == 0x7f000000);
	}
#ifdef AF_INET6
	else
		return IN6_IS_ADDR_LOOPBACK (&addr->addr.sin6_addr);
#else
	else
		return FALSE;
#endif
}